

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::arg>::init
              (EVP_PKEY_CTX *ctx)

{
  int iVar1;
  process_attribute<pybind11::arg,_void> *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  EVP_PKEY_CTX *in_R8;
  
  *(undefined8 *)in_R8 = *(undefined8 *)ctx;
  in_R8[0x59] = (EVP_PKEY_CTX)((byte)in_R8[0x59] | 0x10);
  *(undefined8 *)(in_R8 + 0x70) = *in_RSI;
  *(undefined8 *)(in_R8 + 0x78) = *in_RDX;
  iVar1 = process_attribute<pybind11::arg,_void>::init(in_RCX,in_R8);
  return iVar1;
}

Assistant:

static void init(const Args&... args, function_record *r) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(r);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(r);
        using expander = int[];
        (void) expander{
            0, ((void) process_attribute<typename std::decay<Args>::type>::init(args, r), 0)...};
    }